

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

void __thiscall OSTEI_VRR_Algorithm_Base::Create(OSTEI_VRR_Algorithm_Base *this,QuartetSet *q)

{
  bool bVar1;
  int *__a;
  int *__b;
  undefined8 in_RSI;
  IdxOrder idx_order;
  int i;
  QAM aml;
  Quartet *iq;
  iterator __end1;
  iterator __begin1;
  QuartetSet *__range1;
  QAM qam_max;
  QuartetSet *in_stack_00001518;
  OSTEI_VRR_Algorithm_Base *in_stack_00001520;
  IdxOrder in_stack_00001528;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  QAM *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  int *in_stack_fffffffffffffec8;
  anon_class_8_1_88ad4562 in_stack_fffffffffffffed0;
  Quartet *in_stack_ffffffffffffff08;
  int local_cc;
  _Self local_90;
  _Self local_88;
  undefined8 local_80;
  allocator local_61;
  string local_60 [80];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
           (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8,
           (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(int)in_stack_fffffffffffffeb0,
           (string *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_80 = local_10;
  local_88._M_node =
       (_Base_ptr)
       std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::begin
                 ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                  CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  local_90._M_node =
       (_Base_ptr)
       std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::end
                 ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                  CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  while( true ) {
    bVar1 = std::operator!=(&local_88,&local_90);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<Quartet>::operator*
              ((_Rb_tree_const_iterator<Quartet> *)in_stack_fffffffffffffeb0);
    Quartet::amlist(in_stack_ffffffffffffff08);
    for (local_cc = 0; local_cc < 4; local_cc = local_cc + 1) {
      __a = QAM::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      __b = QAM::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      in_stack_fffffffffffffed0.qam_max = (QAM *)std::max<int>(__a,__b);
      in_stack_fffffffffffffec4 = ((in_stack_fffffffffffffed0.qam_max)->qam)._M_elems[0];
      in_stack_fffffffffffffec8 =
           QAM::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      *in_stack_fffffffffffffec8 = in_stack_fffffffffffffec4;
    }
    QAM::~QAM((QAM *)0x121b13);
    std::_Rb_tree_const_iterator<Quartet>::operator++
              ((_Rb_tree_const_iterator<Quartet> *)in_stack_fffffffffffffeb0);
  }
  std::array<int,_4UL>::begin((array<int,_4UL> *)0x121b40);
  std::array<int,_4UL>::end((array<int,_4UL> *)0x121b4f);
  std::
  stable_sort<int*,OSTEI_VRR_Algorithm_Base::Create(std::set<Quartet,std::less<Quartet>,std::allocator<Quartet>>const&)::__0>
            (in_stack_fffffffffffffec8,
             (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffed0);
  Create_WithOrder(in_stack_00001520,in_stack_00001518,in_stack_00001528);
  QAM::~QAM((QAM *)0x121ba5);
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::Create(const QuartetSet & q)
{
    // Find where the lowest AM is first. This is our initial RR
    QAM qam_max{0,0,0,0};
    for(const Quartet & iq : q)
    {
        QAM aml = iq.amlist();
        for(int i = 0; i < 4; i++)
            qam_max[i] = std::max(qam_max[i], aml[i]);
    }


    // reversed, so we end up with a more "traditional" order
    // (ie, form dsss, then dsps).
    IdxOrder idx_order{3, 2, 1, 0}; 

    std::stable_sort(idx_order.begin(), idx_order.end(),
                     [ & qam_max ] ( int i, int j ) { return qam_max[i] < qam_max[j]; });

    Create_WithOrder(q, idx_order);
}